

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  stbi_uc *psVar13;
  byte bVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  stbi_uc *psVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  stbi_uc *psVar30;
  byte *pbVar31;
  byte *pbVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  long in_FS_OFFSET;
  bool bVar36;
  ulong local_c0;
  ulong local_58;
  ulong uVar25;
  
  bVar36 = depth == 0x10;
  uVar28 = x * out_n;
  uVar4 = uVar28 << bVar36;
  a_00 = a->s->img_n;
  uVar5 = a_00 << bVar36;
  iVar11 = a_00 + 1;
  if (iVar11 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                  ,0x11c8,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar8 = (stbi_uc *)
           stbi__malloc_mad3(x,y,out_n << bVar36,
                             CONCAT31((int3)((uint)iVar11 >> 8),iVar11 == out_n || a_00 == out_n));
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    pcVar9 = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      pcVar9 = "too large";
    }
    else {
      lVar15 = (long)a_00;
      iVar6 = a_00 * x;
      uVar24 = iVar6 * depth + 7U >> 3;
      uVar25 = (ulong)uVar24;
      if ((uVar24 + 1) * y <= raw_len) {
        if (y != 0) {
          lVar20 = (long)(out_n << bVar36);
          iVar7 = x - 1;
          lVar10 = -lVar20;
          lVar34 = -(ulong)uVar4;
          uVar22 = 0;
          local_c0 = 0;
          local_58 = (ulong)x;
          do {
            pbVar31 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              psVar8 = a->out + uVar4 * (int)local_c0;
              if (depth < 8) {
                if (x < uVar24) {
                  pcVar9 = "invalid width";
                  goto LAB_00148005;
                }
                psVar8 = psVar8 + (uVar28 - uVar24);
                uVar5 = 1;
                local_58 = uVar25;
              }
              if (local_c0 == 0) {
                bVar2 = ""[bVar2];
              }
              if (0 < (int)uVar5) {
                uVar29 = 0;
                do {
                  switch(bVar2) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar3 = pbVar31[uVar29];
                    goto LAB_001480a0;
                  case 2:
                  case 4:
                    bVar3 = psVar8[uVar29 + lVar34];
                    break;
                  case 3:
                    bVar3 = psVar8[uVar29 + lVar34] >> 1;
                    break;
                  default:
                    goto switchD_00148086_default;
                  }
                  bVar3 = bVar3 + pbVar31[uVar29];
LAB_001480a0:
                  psVar8[uVar29] = bVar3;
switchD_00148086_default:
                  uVar29 = uVar29 + 1;
                } while (uVar5 != uVar29);
              }
              if (depth == 8) {
                lVar23 = (long)out_n;
                lVar21 = lVar15;
                if (a_00 != out_n) {
                  psVar8[lVar15] = 0xff;
                }
LAB_001480f1:
                pbVar31 = pbVar31 + lVar21;
              }
              else {
                if (depth == 0x10) {
                  lVar21 = (long)(int)uVar5;
                  lVar23 = lVar20;
                  if (a_00 != out_n) {
                    (psVar8 + lVar21)[0] = 0xff;
                    (psVar8 + lVar21)[1] = 0xff;
                  }
                  goto LAB_001480f1;
                }
                pbVar31 = raw + 2;
                lVar23 = 1;
              }
              psVar30 = psVar8 + lVar23;
              if (depth < 8 || a_00 == out_n) {
                uVar12 = ((int)local_58 + -1) * uVar5;
                switch(bVar2) {
                case 0:
                  memcpy(psVar30,pbVar31,(long)(int)uVar12);
                  break;
                case 1:
                  if (0 < (int)uVar12) {
                    uVar29 = 0;
                    do {
                      psVar30[uVar29] = psVar8[uVar29 + (lVar23 - (int)uVar5)] + pbVar31[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar12 != uVar29);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar12) {
                    uVar29 = 0;
                    do {
                      psVar30[uVar29] = psVar30[uVar29 + lVar34] + pbVar31[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar12 != uVar29);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar12) {
                    uVar29 = 0;
                    do {
                      psVar30[uVar29] =
                           (char)((uint)psVar8[uVar29 + (lVar23 - (int)uVar5)] +
                                  (uint)psVar30[uVar29 + lVar34] >> 1) + pbVar31[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar12 != uVar29);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar12) {
                    pbVar32 = psVar8 + (lVar23 - (int)uVar5);
                    uVar29 = 0;
                    do {
                      bVar2 = *pbVar32;
                      bVar3 = psVar30[lVar34];
                      bVar14 = pbVar32[lVar34];
                      iVar17 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar14;
                      uVar27 = iVar17 - (uint)bVar2;
                      uVar19 = -uVar27;
                      if (0 < (int)uVar27) {
                        uVar19 = uVar27;
                      }
                      uVar16 = iVar17 - (uint)bVar3;
                      uVar27 = -uVar16;
                      if (0 < (int)uVar16) {
                        uVar27 = uVar16;
                      }
                      uVar18 = iVar17 - (uint)bVar14;
                      uVar16 = -uVar18;
                      if (0 < (int)uVar18) {
                        uVar16 = uVar18;
                      }
                      if (uVar27 <= uVar16) {
                        bVar14 = bVar3;
                      }
                      if (uVar16 < uVar19) {
                        bVar2 = bVar14;
                      }
                      if (uVar27 < uVar19) {
                        bVar2 = bVar14;
                      }
                      *psVar30 = bVar2 + pbVar31[uVar29];
                      uVar29 = uVar29 + 1;
                      pbVar32 = pbVar32 + 1;
                      psVar30 = psVar30 + 1;
                    } while (uVar12 != uVar29);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar12) {
                    uVar29 = 0;
                    do {
                      psVar30[uVar29] =
                           (psVar8[uVar29 + (lVar23 - (int)uVar5)] >> 1) + pbVar31[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar12 != uVar29);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar12) {
                    uVar29 = 0;
                    do {
                      psVar30[uVar29] = psVar8[uVar29 + (lVar23 - (int)uVar5)] + pbVar31[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar12 != uVar29);
                  }
                }
                pbVar31 = pbVar31 + (int)uVar12;
              }
              else {
                if (iVar11 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                ,0x121c,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                switch(bVar2) {
                case 0:
                  if (iVar7 != 0) {
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        do {
                          psVar30[uVar29] = pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                  break;
                case 1:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar23 + lVar10;
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        do {
                          psVar30[uVar29] = psVar8[uVar29] + pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      psVar8 = psVar8 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                  break;
                case 2:
                  if (iVar7 != 0) {
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        do {
                          psVar30[uVar29] = psVar30[uVar29 + lVar34] + pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                  break;
                case 3:
                  if (iVar7 != 0) {
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        psVar8 = psVar30;
                        do {
                          *psVar8 = (char)((uint)psVar8[lVar10] + (uint)psVar8[lVar34] >> 1) +
                                    pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                          psVar8 = psVar8 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                  break;
                case 4:
                  if (iVar7 != 0) {
                    psVar13 = psVar8 + lVar23 + lVar34;
                    psVar26 = psVar8 + lVar23 + lVar10;
                    psVar8 = psVar8 + lVar23 + (lVar10 - (ulong)uVar4);
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        do {
                          bVar2 = psVar26[uVar29];
                          bVar3 = psVar13[uVar29];
                          bVar14 = psVar8[uVar29];
                          iVar33 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar14;
                          uVar19 = iVar33 - (uint)bVar2;
                          uVar12 = -uVar19;
                          if (0 < (int)uVar19) {
                            uVar12 = uVar19;
                          }
                          uVar27 = iVar33 - (uint)bVar3;
                          uVar19 = -uVar27;
                          if (0 < (int)uVar27) {
                            uVar19 = uVar27;
                          }
                          uVar16 = iVar33 - (uint)bVar14;
                          uVar27 = -uVar16;
                          if (0 < (int)uVar16) {
                            uVar27 = uVar16;
                          }
                          if (uVar19 <= uVar27) {
                            bVar14 = bVar3;
                          }
                          if (uVar27 < uVar12) {
                            bVar2 = bVar14;
                          }
                          if (uVar19 < uVar12) {
                            bVar2 = bVar14;
                          }
                          psVar30[uVar29] = bVar2 + pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      psVar13 = psVar13 + lVar20;
                      psVar26 = psVar26 + lVar20;
                      psVar8 = psVar8 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                  break;
                case 5:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar23 + lVar10;
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        do {
                          psVar30[uVar29] = (psVar8[uVar29] >> 1) + pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      psVar8 = psVar8 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                  break;
                case 6:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar23 + lVar10;
                    iVar17 = iVar7;
                    do {
                      if (0 < (int)uVar5) {
                        uVar29 = 0;
                        do {
                          psVar30[uVar29] = psVar8[uVar29] + pbVar31[uVar29];
                          uVar29 = uVar29 + 1;
                        } while (uVar5 != uVar29);
                      }
                      psVar30[(int)uVar5] = 0xff;
                      pbVar31 = pbVar31 + (int)uVar5;
                      psVar30 = psVar30 + lVar20;
                      psVar8 = psVar8 + lVar20;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                }
                bVar36 = true;
                if (depth == 0x10) {
                  if (x != 0) {
                    psVar8 = a->out + (long)(int)uVar5 + (ulong)uVar22 + 1;
                    uVar29 = (ulong)x;
                    do {
                      *psVar8 = 0xff;
                      psVar8 = psVar8 + lVar20;
                      uVar12 = (int)uVar29 - 1;
                      uVar29 = (ulong)uVar12;
                    } while (uVar12 != 0);
                  }
                  goto LAB_00148622;
                }
              }
              bVar36 = true;
            }
            else {
              pcVar9 = "invalid filter";
LAB_00148005:
              *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
              bVar36 = false;
            }
LAB_00148622:
            if (!bVar36) {
              return 0;
            }
            local_c0 = local_c0 + 1;
            uVar22 = uVar22 + uVar4;
            raw = pbVar31;
          } while (local_c0 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar28 * y != 0) {
            psVar8 = a->out;
            lVar15 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar15 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar15 = lVar15 + 1;
            } while (uVar28 * y != (int)lVar15);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar5 = x - 1;
        lVar15 = uVar28 - uVar25;
        lVar10 = (ulong)uVar5 + 1;
        uVar24 = 0;
        uVar29 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar32 = psVar8 + uVar4 * (int)uVar29;
          pbVar31 = pbVar32 + (uVar28 - uVar25);
          uVar35 = (ulong)uVar24;
          if (depth == 4) {
            iVar11 = iVar6;
            if (1 < iVar6) {
              psVar30 = psVar8 + lVar15;
              iVar7 = iVar6;
              do {
                psVar8[uVar35] = (psVar30[uVar35] >> 4) * bVar2;
                psVar8[uVar35 + 1] = (psVar30[uVar35] & 0xf) * bVar2;
                iVar11 = iVar7 + -2;
                psVar30 = psVar30 + 1;
                psVar8 = psVar8 + 2;
                bVar36 = 3 < iVar7;
                iVar7 = iVar11;
              } while (bVar36);
              pbVar31 = psVar30 + uVar35;
              pbVar32 = psVar8 + uVar35;
            }
            if (iVar11 == 1) {
              bVar3 = *pbVar31 >> 4;
LAB_0014899a:
              bVar2 = bVar3 * bVar2;
LAB_0014899d:
              *pbVar32 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar11 = iVar6;
            if (3 < iVar6) {
              psVar30 = psVar8 + lVar15;
              iVar7 = iVar6;
              do {
                psVar8[uVar35] = (psVar30[uVar35] >> 6) * bVar2;
                psVar8[uVar35 + 1] = (psVar30[uVar35] >> 4 & 3) * bVar2;
                psVar8[uVar35 + 2] = (psVar30[uVar35] >> 2 & 3) * bVar2;
                psVar8[uVar35 + 3] = (psVar30[uVar35] & 3) * bVar2;
                iVar11 = iVar7 + -4;
                psVar30 = psVar30 + 1;
                psVar8 = psVar8 + 4;
                bVar36 = 7 < iVar7;
                iVar7 = iVar11;
              } while (bVar36);
              pbVar31 = psVar30 + uVar35;
              pbVar32 = psVar8 + uVar35;
            }
            if (0 < iVar11) {
              *pbVar32 = (*pbVar31 >> 6) * bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (1 < iVar11) {
              *pbVar32 = (*pbVar31 >> 4 & 3) * bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (iVar11 == 3) {
              bVar3 = *pbVar31 >> 2 & 3;
              goto LAB_0014899a;
            }
          }
          else if (depth == 1) {
            iVar11 = iVar6;
            if (7 < iVar6) {
              psVar30 = psVar8 + lVar15;
              iVar7 = iVar6;
              do {
                psVar8[uVar35] = (char)psVar30[uVar35] >> 7 & bVar2;
                psVar8[uVar35 + 1] = (char)(psVar30[uVar35] * '\x02') >> 7 & bVar2;
                psVar8[uVar35 + 2] = (char)(psVar30[uVar35] << 2) >> 7 & bVar2;
                psVar8[uVar35 + 3] = (char)(psVar30[uVar35] << 3) >> 7 & bVar2;
                psVar8[uVar35 + 4] = (char)(psVar30[uVar35] << 4) >> 7 & bVar2;
                psVar8[uVar35 + 5] = (char)(psVar30[uVar35] << 5) >> 7 & bVar2;
                psVar8[uVar35 + 6] = (char)(psVar30[uVar35] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar30[uVar35] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar35 + 7] = bVar3;
                iVar11 = iVar7 + -8;
                psVar30 = psVar30 + 1;
                psVar8 = psVar8 + 8;
                bVar36 = 0xf < iVar7;
                iVar7 = iVar11;
              } while (bVar36);
              pbVar31 = psVar30 + uVar35;
              pbVar32 = psVar8 + uVar35;
            }
            if (0 < iVar11) {
              *pbVar32 = (char)*pbVar31 >> 7 & bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (1 < iVar11) {
              *pbVar32 = (char)(*pbVar31 * '\x02') >> 7 & bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (2 < iVar11) {
              *pbVar32 = (char)(*pbVar31 << 2) >> 7 & bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (3 < iVar11) {
              *pbVar32 = (char)(*pbVar31 << 3) >> 7 & bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (4 < iVar11) {
              *pbVar32 = (char)(*pbVar31 << 4) >> 7 & bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (5 < iVar11) {
              *pbVar32 = (char)(*pbVar31 << 5) >> 7 & bVar2;
              pbVar32 = pbVar32 + 1;
            }
            if (iVar11 == 7) {
              bVar2 = (char)(*pbVar31 << 6) >> 7 & bVar2;
              goto LAB_0014899d;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar20 = lVar10;
              if (-1 < (int)uVar5) {
                do {
                  psVar8[lVar20 * 2 + (uVar35 - 1)] = 0xff;
                  psVar8[lVar20 * 2 + (uVar35 - 2)] = psVar8[lVar20 + (uVar35 - 1)];
                  lVar34 = lVar20 + -1;
                  bVar36 = 0 < lVar20;
                  lVar20 = lVar34;
                } while (lVar34 != 0 && bVar36);
              }
            }
            else {
              if (a_00 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                              ,0x1275,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar5) {
                psVar30 = psVar8 + (ulong)uVar5 * 3 + 2 + uVar35;
                lVar20 = lVar10;
                do {
                  psVar8[lVar20 * 4 + (uVar35 - 1)] = 0xff;
                  psVar8[lVar20 * 4 + (uVar35 - 2)] = *psVar30;
                  psVar8[lVar20 * 4 + (uVar35 - 3)] = psVar30[-1];
                  psVar8[lVar20 * 4 + (uVar35 - 4)] = psVar30[-2];
                  psVar30 = psVar30 + -3;
                  lVar34 = lVar20 + -1;
                  bVar36 = 0 < lVar20;
                  lVar20 = lVar34;
                } while (lVar34 != 0 && bVar36);
              }
            }
          }
          uVar29 = uVar29 + 1;
          uVar24 = uVar24 + uVar4;
          if (uVar29 == y) {
            return 1;
          }
        } while( true );
      }
      pcVar9 = "not enough pixels";
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }